

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::MethodDescriptor::GetLocationPath
          (MethodDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  iterator iVar1;
  int local_14;
  
  ServiceDescriptor::GetLocationPath(*(ServiceDescriptor **)(this + 0x10),output);
  iVar1._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)output,iVar1,
               &ServiceDescriptorProto::kMethodFieldNumber);
  }
  else {
    *iVar1._M_current = 2;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar1,&local_14);
  }
  else {
    *iVar1._M_current =
         (int)((ulong)((long)this - *(long *)(*(long *)(this + 0x10) + 0x28)) >> 3) * -0x3b13b13b;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void MethodDescriptor::GetLocationPath(std::vector<int>* output) const {
  service()->GetLocationPath(output);
  output->push_back(ServiceDescriptorProto::kMethodFieldNumber);
  output->push_back(index());
}